

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

void __thiscall CVmHashEntry::CVmHashEntry(CVmHashEntry *this,char *str,size_t len,int copy)

{
  void *__dest;
  int in_ECX;
  ulong in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  char *buf;
  
  *in_RDI = &PTR__CVmHashEntry_00445610;
  in_RDI[1] = 0;
  if (in_ECX == 0) {
    in_RDI[2] = in_RSI;
  }
  else {
    __dest = operator_new__(in_RDX);
    memcpy(__dest,in_RSI,in_RDX);
    in_RDI[2] = __dest;
  }
  in_RDI[3] = in_RDX;
  *(byte *)(in_RDI + 4) = *(byte *)(in_RDI + 4) & 0xfe | (byte)in_ECX & 1;
  return;
}

Assistant:

CVmHashEntry::CVmHashEntry(const char *str, size_t len, int copy)
{
    /* not linked into a list yet */
    nxt_ = 0;

    /* see if we can use the original string or need to make a private copy */
    if (copy)
    {
        char *buf;

        /* allocate space for a copy */
        buf = new char[len];

        /* copy it into our buffer */
        memcpy(buf, str, len * sizeof(*buf));

        /* remember it */
        str_ = buf;
    }
    else
    {
        /* we can use the original */
        str_ = str;
    }

    /* remember the length */
    len_ = len;

    /* remember whether or not we own the string */
    copy_ = copy;
}